

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O3

bool __thiscall mpt::item_array<mpt::metatype>::compact(item_array<mpt::metatype> *this)

{
  type_traits **id;
  _func_int **pp_Var1;
  _func_int **pp_Var2;
  content<mpt::item<mpt::metatype>_> *pcVar3;
  metatype *r;
  content<mpt::item<mpt::metatype>_> *pcVar4;
  content<mpt::item<mpt::metatype>_> *pcVar5;
  long len;
  
  pcVar4 = (this->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref;
  pcVar3 = pcVar4 + 1;
  if (pcVar4 == (content<mpt::item<mpt::metatype>_> *)0x0) {
    pcVar4 = (content<mpt::item<mpt::metatype>_> *)0x0;
    pcVar3 = (content<mpt::item<mpt::metatype>_> *)0x0;
  }
  else {
    pcVar4 = (content<mpt::item<mpt::metatype>_> *)
             ((long)&(pcVar3->super_buffer)._vptr_buffer +
             ((pcVar4->super_buffer)._used & 0xffffffffffffffe0));
  }
  pcVar5 = (content<mpt::item<mpt::metatype>_> *)0x0;
  if (pcVar3 != pcVar4) {
    len = 0;
    do {
      while (pp_Var1 = (pcVar3->super_buffer)._vptr_buffer, pp_Var1 == (_func_int **)0x0) {
        if (pcVar5 == (content<mpt::item<mpt::metatype>_> *)0x0) {
          pcVar5 = pcVar3;
        }
LAB_001344aa:
        pcVar3 = pcVar3 + 1;
        if (pcVar3 == pcVar4) {
          content<mpt::item<mpt::metatype>_>::set_length
                    ((this->super_unique_array<mpt::item<mpt::metatype>_>)._ref._ref,len);
          pcVar5 = (content<mpt::item<mpt::metatype>_> *)0x1;
          goto LAB_001344d5;
        }
      }
      len = len + 1;
      if (pcVar5 != (content<mpt::item<mpt::metatype>_> *)0x0) {
        (pcVar3->super_buffer)._vptr_buffer = (_func_int **)0x0;
        pp_Var2 = (pcVar5->super_buffer)._vptr_buffer;
        if (pp_Var2 != (_func_int **)0x0) {
          (**(code **)(*pp_Var2 + 8))();
        }
        (pcVar5->super_buffer)._vptr_buffer = pp_Var1;
        id = &(pcVar3->super_buffer)._content_traits;
        identifier::operator=
                  ((identifier *)&(pcVar5->super_buffer)._content_traits,(identifier *)id);
        (pcVar5->super_buffer)._used = (pcVar3->super_buffer)._used;
        identifier::set_name((identifier *)id,(char *)0x0,0);
        pp_Var1 = (pcVar3->super_buffer)._vptr_buffer;
        if (pp_Var1 != (_func_int **)0x0) {
          (**(code **)(*pp_Var1 + 8))();
        }
        pcVar5 = pcVar5 + 1;
        goto LAB_001344aa;
      }
      pcVar3 = pcVar3 + 1;
      pcVar5 = (content<mpt::item<mpt::metatype>_> *)0x0;
    } while (pcVar3 != pcVar4);
  }
LAB_001344d5:
  return SUB81(pcVar5,0);
}

Assistant:

bool compact()
	{
		item<T> *space = 0;
		long len = 0;
		for (item<T> *pos = this->begin(), *to = this->end(); pos != to; ++pos) {
			T *c = pos->instance();
			if (!c) {
				if (!space) space = pos;
				continue;
			}
			++len;
			if (!space) continue;
#if __cplusplus >= 201103L
			*space = std::move(*pos);
#else
			space->operator = (static_cast<const identifier &>(*pos));
			space->set_instance(pos->detach());
#endif
			pos->~item<T>();
			++space;
		}
		if (!space) {
			return false;
		}
		this->_ref.instance()->set_length(len);
		return true;
	}